

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int lhAllocateSpace(lhpage *pPage,sxu64 nAmount,sxu16 *pOfft)

{
  lhash_kv_engine *plVar1;
  unqlite_page *puVar2;
  sxu16 sVar3;
  int iVar4;
  ushort *puVar5;
  long lVar6;
  uint uVar7;
  ushort uVar8;
  uint uVar9;
  uint *puVar10;
  ulong uVar11;
  lhcell *plVar12;
  uchar *puVar13;
  ushort *puVar14;
  uint *pDest;
  uint uVar15;
  ushort local_40;
  
  iVar4 = -0x49;
  if ((nAmount <= pPage->nFree) &&
     ((uVar15 = (uint)nAmount, 9 < pPage->nCell || ((int)uVar15 < pPage->pHash->iPageSize / 2)))) {
    plVar1 = pPage->pHash;
    local_40 = (pPage->sHdr).iFree;
    uVar7 = uVar15 & 0xffff;
    puVar5 = (ushort *)0x0;
    do {
      if ((long)plVar1->iPageSize <= (long)(ulong)local_40) {
        return -0x49;
      }
      puVar14 = (ushort *)(pPage->pRaw->zData + local_40);
      local_40 = *puVar14 << 8 | *puVar14 >> 8;
      uVar8 = puVar14[1] << 8 | puVar14[1] >> 8;
      if ((ushort)nAmount <= uVar8) goto LAB_0011408b;
      puVar5 = puVar14;
    } while (local_40 != 0);
    puVar5 = (ushort *)(*plVar1->pIo->xTmpPage)(plVar1->pIo->pHandle);
    uVar11 = (pPage->sHdr).iSlave;
    plVar12 = pPage->pMaster->pList;
    *(ulong *)(puVar5 + 2) =
         uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 | (uVar11 & 0xff0000000000) >> 0x18 |
         (uVar11 & 0xff00000000) >> 8 | (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
         (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
    pDest = (uint *)(puVar5 + 6);
    puVar10 = (uint *)((long)plVar1->iPageSize + (long)puVar5);
    (pPage->sHdr).iOfft = 0;
    for (; plVar12 != (lhcell *)0x0; plVar12 = plVar12->pNext) {
      puVar2 = plVar12->pPage->pRaw;
      if (puVar2->iPage == pPage->pRaw->iPage) {
        if (plVar12->iOvfl == 0) {
          puVar13 = puVar2->zData + (ulong)plVar12->iStart + 0x1a;
        }
        else {
          puVar13 = (uchar *)0x0;
        }
        plVar12->iNext = (pPage->sHdr).iOfft;
        sVar3 = (short)pDest - (short)puVar5;
        plVar12->iStart = sVar3;
        (pPage->sHdr).iOfft = sVar3;
        uVar9 = plVar12->nHash;
        *pDest = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
        uVar9 = plVar12->nKey;
        pDest[1] = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
        uVar11 = plVar12->nData;
        *(ulong *)(pDest + 2) =
             uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
             (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
             (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28 |
             uVar11 << 0x38;
        *(sxu16 *)(pDest + 4) = plVar12->iNext << 8 | plVar12->iNext >> 8;
        uVar11 = plVar12->iOvfl;
        *(ulong *)((long)pDest + 0x12) =
             uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
             (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
             (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28 |
             uVar11 << 0x38;
        pDest = (uint *)((long)pDest + 0x1a);
        if (puVar13 != (uchar *)0x0) {
          SyMemcpy(puVar13,pDest,plVar12->nKey + (int)plVar12->nData);
          pDest = (uint *)((long)pDest + (ulong)plVar12->nKey + plVar12->nData);
        }
        if (puVar10 <= pDest) break;
      }
    }
    uVar11 = (long)puVar10 - (long)pDest;
    pPage->nFree = (sxu16)uVar11;
    if ((uVar11 & 0xfffc) == 0) {
      pPage->nFree = 0;
      (pPage->sHdr).iFree = 0;
    }
    else {
      (pPage->sHdr).iFree = (short)pDest - (short)puVar5;
      *(ushort *)pDest = 0;
      *(sxu16 *)((long)pDest + 2) = pPage->nFree << 8 | pPage->nFree >> 8;
    }
    uVar8 = (pPage->sHdr).iOfft;
    *puVar5 = uVar8 << 8 | uVar8 >> 8;
    uVar8 = (pPage->sHdr).iFree;
    puVar5[1] = uVar8 << 8 | uVar8 >> 8;
    SyMemcpy(puVar5,pPage->pRaw->zData,plVar1->iPageSize);
    uVar8 = pPage->nFree;
    iVar4 = -0x49;
    if (uVar7 <= uVar8) {
      puVar14 = (ushort *)(pPage->pRaw->zData + (pPage->sHdr).iFree);
      local_40 = 0;
      puVar5 = (ushort *)0x0;
LAB_0011408b:
      uVar9 = (uint)uVar8;
      iVar4 = (*pPage->pHash->pIo->xWrite)(pPage->pRaw);
      if (iVar4 == 0) {
        puVar13 = pPage->pRaw->zData;
        uVar8 = (short)puVar14 - (short)puVar13;
        *pOfft = uVar8;
        if ((int)(uVar9 - uVar7) < 4 || uVar9 < uVar7) {
          nAmount = (sxu64)uVar9;
        }
        else {
          lVar6 = (ulong)uVar7 + (ulong)uVar8;
          puVar13[lVar6 + 1] = (uchar)local_40;
          puVar13[lVar6] = (uchar)(local_40 >> 8);
          puVar13[lVar6 + 3] = (uchar)(uVar9 - uVar15);
          puVar13[lVar6 + 2] = (uchar)(uVar9 - uVar15 >> 8);
          local_40 = ((short)puVar13 + (short)lVar6) - (short)*(undefined4 *)&pPage->pRaw->zData;
        }
        if (puVar5 == (ushort *)0x0) {
          (pPage->sHdr).iFree = local_40;
          puVar13 = pPage->pRaw->zData;
          puVar13[3] = (uchar)local_40;
          puVar5 = (ushort *)(puVar13 + 2);
        }
        else {
          *(uchar *)((long)puVar5 + 1) = (uchar)local_40;
        }
        *(char *)puVar5 = (char)(local_40 >> 8);
        pPage->nFree = pPage->nFree - (short)nAmount;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

static int lhAllocateSpace(lhpage *pPage,sxu64 nAmount,sxu16 *pOfft)
{
	const unsigned char *zEnd,*zPtr;
	sxu16 iNext,iBlksz,nByte;
	unsigned char *zPrev;
	int rc;
	if( (sxu64)pPage->nFree < nAmount ){
		/* Don't bother looking for a free chunk */
		return UNQLITE_FULL;
	}
	if( pPage->nCell < 10 && ((int)nAmount >= (pPage->pHash->iPageSize / 2)) ){
		/* Big chunk need an overflow page for its data */
		return UNQLITE_FULL;
	}
	zPtr = &pPage->pRaw->zData[pPage->sHdr.iFree];
	zEnd = &pPage->pRaw->zData[pPage->pHash->iPageSize];
	nByte = (sxu16)nAmount;
	zPrev = 0;
	iBlksz = 0; /* cc warning */
	/* Perform the lookup */
	for(;;){
		if( zPtr >= zEnd ){
			return UNQLITE_FULL;
		}
		/* Offset of the next free block */
		SyBigEndianUnpack16(zPtr,&iNext);
		/* Block size */
		SyBigEndianUnpack16(&zPtr[2],&iBlksz);
		if( iBlksz >= nByte ){
			/* Got one */
			break;
		}
		zPrev = (unsigned char *)zPtr;
		if( iNext == 0 ){
			/* No more free blocks, defragment the page */
			rc = lhPageDefragment(pPage);
			if( rc == UNQLITE_OK && pPage->nFree >= nByte) {
				/* Free blocks are merged together */
				iNext = 0;
				zPtr = &pPage->pRaw->zData[pPage->sHdr.iFree];
				iBlksz = pPage->nFree;
				zPrev = 0;
				break;
			}else{
				return UNQLITE_FULL;
			}
		}
		/* Point to the next free block */
		zPtr = &pPage->pRaw->zData[iNext];
	}
	/* Acquire writer lock on this page */
	rc = pPage->pHash->pIo->xWrite(pPage->pRaw);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Save block offset */
	*pOfft = (sxu16)(zPtr - pPage->pRaw->zData);
	/* Fix pointers */
	if( iBlksz >= nByte && (iBlksz - nByte) > 3 ){
		unsigned char *zBlock = &pPage->pRaw->zData[(*pOfft) + nByte];
		/* Create a new block */
		zPtr = zBlock;
		SyBigEndianPack16(zBlock,iNext); /* Offset of the next block */
		SyBigEndianPack16(&zBlock[2],iBlksz-nByte); /* Block size*/
		/* Offset of the new block */
		iNext = (sxu16)(zPtr - pPage->pRaw->zData);
		iBlksz = nByte;
	}
	/* Fix offsets */
	if( zPrev ){
		SyBigEndianPack16(zPrev,iNext);
	}else{
		/* First block */
		pPage->sHdr.iFree = iNext;
		/* Reflect on the page header */
		SyBigEndianPack16(&pPage->pRaw->zData[2/* Offset of the first cell1*/],iNext);
	}
	/* All done */
	pPage->nFree -= iBlksz;
	return UNQLITE_OK;
}